

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O2

void hexToByte(string *hex,BYTE *out)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  string local_50;
  
  uVar1 = (uint)hex->_M_string_length;
  uVar2 = (long)(int)uVar1 / 2;
  uVar6 = 0;
  iVar3 = (int)uVar2;
  uVar5 = 0;
  if (0 < iVar3) {
    uVar5 = uVar2 & 0xffffffff;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)hex);
    iVar4 = std::__cxx11::stoi(&local_50,(size_t *)0x0,0x10);
    out[uVar6] = (BYTE)iVar4;
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)hex);
    iVar4 = std::__cxx11::stoi(&local_50,(size_t *)0x0,0x10);
    out[iVar3] = (BYTE)iVar4;
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void hexToByte(string hex, BYTE* out) {
	int length = hex.length();
	for (int i = 0; i < length / 2; i++) {
		out[i] = stoi(hex.substr(length - 2 - i * 2, 2), 0, 16);
	}
	if ((length & 1) != 0)
		out[length / 2] = stoi(hex.substr(0, 1), 0, 16);
}